

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall libcellml::Annotator::Annotator(Annotator *this)

{
  pointer *ppuVar1;
  _Rb_tree_header *p_Var2;
  LoggerImpl *pLVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
  local_58;
  
  pLVar3 = (LoggerImpl *)operator_new(0xb8);
  ppuVar1 = &pLVar3[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  memset(pLVar3,0,0xb8);
  pLVar3[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ppuVar1;
  pLVar3[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ppuVar1;
  pLVar3[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pLVar3[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar3[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar3[1].mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb4da55;
  pLVar3[1].mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Logger::Logger(&this->super_Logger,pLVar3);
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Annotator_002f56f0;
  pLVar3 = Logger::pFunc(&this->super_Logger);
  pLVar3[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  p_Var2 = &local_58._M_impl.super__Rb_tree_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl._0_8_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pLVar3 = Logger::pFunc(&this->super_Logger);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
           *)&pLVar3[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    *(_Rb_tree_color *)
     &pLVar3[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
         local_58._M_impl.super__Rb_tree_header._M_header._M_color;
    pLVar3[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
    pLVar3[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    pLVar3[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_58._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         (_Base_ptr)
         &pLVar3[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    pLVar3[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_58._M_impl.super__Rb_tree_header._M_node_count
    ;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

Annotator::Annotator()
    : Logger(new Annotator::AnnotatorImpl())
{
    pFunc()->mAnnotator = this;
    pFunc()->mIdList = std::multimap<std::string, AnyCellmlElementPtr>();
}